

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor.h
# Opt level: O0

void Eigen::internal::
     visitor_impl<Eigen::internal::max_coeff_visitor<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>,_-1,_1,_true>,_-1,_1,_false>_>_>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>,_-1,_1,_true>,_-1,_1,_false>_>,_-1>
     ::run(CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>
           *mat,max_coeff_visitor<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>_>
                *visitor)

{
  long lVar1;
  Index IVar2;
  max_coeff_visitor<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>_>
  *pmVar3;
  Index IVar4;
  Scalar local_48;
  long local_40;
  Index i_1;
  Index j;
  long local_28;
  Index i;
  max_coeff_visitor<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>_>
  *local_18;
  max_coeff_visitor<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>_>
  *visitor_local;
  CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>
  *mat_local;
  
  local_18 = visitor;
  visitor_local =
       (max_coeff_visitor<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>_>
        *)mat;
  i = (Index)CwiseUnaryOpImpl<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>,_-1,_1,_true>,_-1,_1,_false>,_Eigen::Dense>
             ::coeff((CwiseUnaryOpImpl<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>,_Eigen::Dense>
                      *)mat,0,0);
  coeff_visitor<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>,_-1,_1,_true>,_-1,_1,_false>_>_>
  ::init(&visitor->
          super_coeff_visitor<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>_>
         ,(EVP_PKEY_CTX *)&i);
  local_28 = 1;
  while( true ) {
    lVar1 = local_28;
    IVar4 = CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>,_-1,_1,_true>,_-1,_1,_false>_>
            ::rows((CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>
                    *)visitor_local);
    pmVar3 = local_18;
    if (IVar4 <= lVar1) break;
    j = (Index)CwiseUnaryOpImpl<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>,_-1,_1,_true>,_-1,_1,_false>,_Eigen::Dense>
               ::coeff((CwiseUnaryOpImpl<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>,_Eigen::Dense>
                        *)visitor_local,local_28,0);
    max_coeff_visitor<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>,_-1,_1,_true>,_-1,_1,_false>_>_>
    ::operator()(pmVar3,(Scalar *)&j,local_28,0);
    local_28 = local_28 + 1;
  }
  i_1 = 1;
  while( true ) {
    IVar2 = i_1;
    IVar4 = CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>,_-1,_1,_true>,_-1,_1,_false>_>
            ::cols((CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>
                    *)visitor_local);
    if (IVar4 <= IVar2) break;
    local_40 = 0;
    while( true ) {
      lVar1 = local_40;
      IVar4 = CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>,_-1,_1,_true>,_-1,_1,_false>_>
              ::rows((CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>
                      *)visitor_local);
      pmVar3 = local_18;
      if (IVar4 <= lVar1) break;
      local_48 = CwiseUnaryOpImpl<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>,_-1,_1,_true>,_-1,_1,_false>,_Eigen::Dense>
                 ::coeff((CwiseUnaryOpImpl<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>,_Eigen::Dense>
                          *)visitor_local,local_40,i_1);
      max_coeff_visitor<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>,_-1,_1,_true>,_-1,_1,_false>_>_>
      ::operator()(pmVar3,&local_48,local_40,i_1);
      local_40 = local_40 + 1;
    }
    i_1 = i_1 + 1;
  }
  return;
}

Assistant:

static inline void run(const Derived& mat, Visitor& visitor)
  {
    visitor.init(mat.coeff(0,0), 0, 0);
    for(Index i = 1; i < mat.rows(); ++i)
      visitor(mat.coeff(i, 0), i, 0);
    for(Index j = 1; j < mat.cols(); ++j)
      for(Index i = 0; i < mat.rows(); ++i)
        visitor(mat.coeff(i, j), i, j);
  }